

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O2

int read_bin(string *str)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  uint uVar5;
  string sStack_258;
  string local_238;
  ifstream bin;
  byte abStack_1f8 [488];
  
  std::ifstream::ifstream(&bin,(string *)str,_S_in|_S_bin);
  if ((abStack_1f8[*(long *)(_bin + -0x18)] & 5) == 0) {
    std::__cxx11::string::string((string *)&sStack_258,(string *)str);
    GetPathOrURLShortName(&local_238,&sStack_258);
    std::__cxx11::string::operator=((string *)&FileName_abi_cxx11_,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&sStack_258);
    lVar2 = std::__cxx11::string::rfind((char)str,0x5c);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&local_238,(ulong)str);
      std::__cxx11::string::operator=((string *)&Directory_abi_cxx11_,(string *)&local_238);
      std::__cxx11::string::~string((string *)&local_238);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_c23d);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::istream::seekg((long)&bin,_S_beg);
    file_size = std::istream::tellg();
    std::istream::seekg((long)&bin,_S_beg);
    std::istream::read((char *)&bin,0x10a3b0);
    memcpy(stack_ptr + registe_ptr->SP,(str->_M_dataplus)._M_p,str->_M_string_length + 1);
    if (str->_M_string_length - 4 < 0xfffffffffffffffb) {
      iVar1 = (int)str->_M_string_length;
      uVar5 = iVar1 + 1;
      if ((uVar5 & 3) == 0) {
        registe_ptr->SP = (iVar1 + registe_ptr->SP) - 3;
      }
      else {
        registe_ptr->SP = registe_ptr->SP + (uVar5 & 0xfffffffc);
      }
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&bin);
    return 1;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 0xf4;
  __cxa_throw(puVar4,&int::typeinfo,0);
}

Assistant:

int read_bin(std::string str) {
	ifstream bin(str, ios::in | ios::binary);
	
	if (bin) {
		FileName = GetPathOrURLShortName(str);
		const size_t last_slash_idx = str.rfind('\\');
		if (std::string::npos != last_slash_idx)
		{
			Directory = str.substr(0, last_slash_idx);
		}
		std::cout << "打开文件成功！" << std::endl;
		bin.seekg(0, ios::end);//移到文件尾部
		file_size = bin.tellg();//获取文件大小
		bin.seekg(0, ios::beg);//移到文件头部
		bin.read(origin_bin, file_size);
		int stack_offset;
		memcpy(stack_ptr + registe_ptr->SP, str.c_str(), str.length() + 1);//先写再加
		if (str.length() + 1 > 4) {
			if ((str.length() + 1) % 4 == 0) {//实际路径为取得长度+\x00
				stack_offset = str.length() +1;
				registe_ptr->SP += stack_offset;
				registe_ptr->SP -= 4;
			}
		else
		{
			stack_offset = 4 * ((str.length()+1) / 4) + 4;
			registe_ptr->SP += stack_offset;
			registe_ptr->SP -= 4;
		}
	}
	bin.close();
	return LVM_SUCCESS;
	}else throw(LVM_BIN_OPEN_ERROR);
}